

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

string * __thiscall
flatbuffers::IntToStringHex_abi_cxx11_
          (string *__return_storage_ptr__,flatbuffers *this,int i,int xdigits)

{
  uint *puVar1;
  long lVar2;
  char cVar3;
  stringstream ss;
  stringstream asStack_1a8 [16];
  long local_198 [2];
  long lStack_188;
  uint auStack_180 [22];
  ios_base local_128 [112];
  char acStack_b8 [152];
  
  if (-1 < (int)this) {
    std::__cxx11::stringstream::stringstream(asStack_1a8);
    *(long *)((long)&lStack_188 + *(long *)(local_198[0] + -0x18)) = (long)i;
    lVar2 = *(long *)(local_198[0] + -0x18);
    if (acStack_b8[lVar2 + 1] == '\0') {
      cVar3 = std::ios::widen((char)asStack_1a8 + (char)lVar2 + '\x10');
      acStack_b8[lVar2] = cVar3;
      acStack_b8[lVar2 + 1] = '\x01';
    }
    acStack_b8[lVar2] = '0';
    *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) =
         *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) & 0xffffffb5 | 8;
    puVar1 = (uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18));
    *puVar1 = *puVar1 | 0x4000;
    std::ostream::operator<<((ostream *)local_198,(int)this);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(asStack_1a8);
    std::ios_base::~ios_base(local_128);
    return __return_storage_ptr__;
  }
  __assert_fail("i >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                ,0xbf,"std::string flatbuffers::IntToStringHex(int, int)");
}

Assistant:

inline std::string IntToStringHex(int i, int xdigits) {
  FLATBUFFERS_ASSERT(i >= 0);
  // clang-format off

  #ifndef FLATBUFFERS_PREFER_PRINTF
    std::stringstream ss;
    ss << std::setw(xdigits) << std::setfill('0') << std::hex << std::uppercase
       << i;
    return ss.str();
  #else // FLATBUFFERS_PREFER_PRINTF
    return NumToStringImplWrapper(i, "%.*X", xdigits);
  #endif // FLATBUFFERS_PREFER_PRINTF
  // clang-format on
}